

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O2

MethodHandle * __thiscall
jsonrpccxx::GetHandle<WarehouseServer,std::vector<Product,std::allocator<Product>>>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          offset_in_WarehouseServer_to_subr method,WarehouseServer *instance)

{
  function<std::vector<Product,_std::allocator<Product>_>_()> *f;
  function<std::vector<Product,_std::allocator<Product>_>_()> function;
  function<std::vector<Product,_std::allocator<Product>_>_()> fStack_68;
  function<std::vector<Product,_std::allocator<Product>_>_()> local_48;
  anon_class_24_2_b747b145 local_28;
  
  local_28.instance = instance;
  local_28.method = (offset_in_WarehouseServer_to_subr)this;
  local_28._16_8_ = method;
  std::function<std::vector<Product,std::allocator<Product>>()>::
  function<jsonrpccxx::GetHandle<WarehouseServer,std::vector<Product,std::allocator<Product>>>(std::vector<Product,std::allocator<Product>>(WarehouseServer::*)(),WarehouseServer&)::_lambda()_1_,void>
            ((function<std::vector<Product,std::allocator<Product>>()> *)&local_48,&local_28);
  std::function<std::vector<Product,_std::allocator<Product>_>_()>::function(&fStack_68,&local_48);
  GetHandle<std::vector<Product,std::allocator<Product>>>
            (__return_storage_ptr__,(jsonrpccxx *)&fStack_68,f);
  std::_Function_base::~_Function_base(&fStack_68.super__Function_base);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle GetHandle(ReturnType (T::*method)(ParamTypes...), T &instance) {
    std::function<ReturnType(ParamTypes...)> function = [&instance, method](ParamTypes &&... params) -> ReturnType {
      return (instance.*method)(std::forward<ParamTypes>(params)...);
    };
    return GetHandle(function);
  }